

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  allocator<char> local_51;
  ScopedElement e;
  string local_40 [32];
  
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>(local_40,"OverallResults",&local_51);
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)&this->m_xml,(XmlFormatting)local_40);
    std::__cxx11::string::~string(local_40);
    name.m_size = 9;
    name.m_start = "successes";
    XmlWriter::writeAttribute<unsigned_long,void>
              (e.m_writer,name,&(sectionStats->assertions).passed);
    name_00.m_size = 8;
    name_00.m_start = "failures";
    XmlWriter::writeAttribute<unsigned_long,void>
              (e.m_writer,name_00,&(sectionStats->assertions).failed);
    name_01.m_size = 0x10;
    name_01.m_start = "expectedFailures";
    XmlWriter::writeAttribute<unsigned_long,void>
              (e.m_writer,name_01,&(sectionStats->assertions).failedButOk);
    name_02.m_size = 7;
    name_02.m_start = "skipped";
    XmlWriter::writeAttribute(e.m_writer,name_02,(sectionStats->assertions).skipped != 0);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xb])();
    if (iVar1 == 1) {
      name_03.m_size = 0x11;
      name_03.m_start = "durationInSeconds";
      XmlWriter::writeAttribute<double,void>(e.m_writer,name_03,&sectionStats->durationInSeconds);
    }
    XmlWriter::ScopedElement::~ScopedElement(&e);
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if ( --m_sectionDepth > 0 ) {
            {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes"_sr, sectionStats.assertions.passed );
                e.writeAttribute( "failures"_sr, sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures"_sr, sectionStats.assertions.failedButOk );
                e.writeAttribute( "skipped"_sr, sectionStats.assertions.skipped > 0 );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds"_sr, sectionStats.durationInSeconds );
            }
            // Ends assertion tag
            m_xml.endElement();
        }
    }